

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O1

target_ulong helper_find_slb_vsid(CPUPPCState_conflict2 *env,target_ulong rb)

{
  bool bVar1;
  ppc_slb_t *ppVar2;
  uint64_t uVar3;
  
  bVar1 = (int)env->msr < 0;
  if (env->mmu_model != POWERPC_MMU_BOOKE206) {
    bVar1 = (long)env->msr < 0;
  }
  if (!bVar1) {
    rb = rb & 0xffffffff;
  }
  ppVar2 = slb_lookup((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write,rb);
  if (ppVar2 == (ppc_slb_t *)0x0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = ppVar2->vsid;
  }
  return uVar3;
}

Assistant:

target_ulong helper_find_slb_vsid(CPUPPCState *env, target_ulong rb)
{
    PowerPCCPU *cpu = env_archcpu(env);
    target_ulong rt = 0;

    if (ppc_find_slb_vsid(cpu, rb, &rt) < 0) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL, GETPC());
    }
    return rt;
}